

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::emit_sof(jpeg_encoder *this)

{
  long in_RDI;
  int i;
  uint i_00;
  uint8 i_01;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  i_00 = (uint)((ulong)in_RDI >> 0x20);
  emit_marker((jpeg_encoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),i_00);
  emit_word((jpeg_encoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),i_00);
  i_01 = (uint8)((ulong)in_RDI >> 0x38);
  emit_byte((jpeg_encoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),i_01);
  emit_word((jpeg_encoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),i_00);
  emit_word((jpeg_encoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),i_00);
  emit_byte((jpeg_encoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),i_01);
  for (iVar1 = 0; iVar1 < (int)(uint)*(byte *)(in_RDI + 0x14); iVar1 = iVar1 + 1) {
    emit_byte((jpeg_encoder *)CONCAT44(iVar1,in_stack_fffffffffffffff0),i_01);
    emit_byte((jpeg_encoder *)CONCAT44(iVar1,in_stack_fffffffffffffff0),i_01);
    emit_byte((jpeg_encoder *)CONCAT44(iVar1,in_stack_fffffffffffffff0),i_01);
  }
  return;
}

Assistant:

void jpeg_encoder::emit_sof() {
  emit_marker(M_SOF0); /* baseline */
  emit_word(3 * m_num_components + 2 + 5 + 1);
  emit_byte(8); /* precision */
  emit_word(m_image_y);
  emit_word(m_image_x);
  emit_byte(m_num_components);
  for (int i = 0; i < m_num_components; i++) {
    emit_byte(static_cast<uint8>(i + 1));                  /* component ID     */
    emit_byte((m_comp_h_samp[i] << 4) + m_comp_v_samp[i]); /* h and v sampling */
    emit_byte(i > 0);                                      /* quant. table num */
  }
}